

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockContextBuildAddWindowsToNodes(ImGuiContext *ctx,ImGuiID root_id)

{
  ImGuiWindow *window_00;
  ImGuiWindow **ppIVar1;
  ImGuiDockNode *node_00;
  ImGuiDockNode *pIVar2;
  ImGuiDockNode *node;
  ImGuiWindow *window;
  int n;
  ImGuiContext *g;
  ImGuiID root_id_local;
  ImGuiContext *ctx_local;
  
  window._4_4_ = 0;
  do {
    if ((ctx->Windows).Size <= window._4_4_) {
      return;
    }
    ppIVar1 = ImVector<ImGuiWindow_*>::operator[](&ctx->Windows,window._4_4_);
    window_00 = *ppIVar1;
    if (((window_00->DockId != 0) && (ctx->FrameCount + -1 <= window_00->LastFrameActive)) &&
       (window_00->DockNode == (ImGuiDockNode *)0x0)) {
      node_00 = DockContextFindNodeByID(ctx,window_00->DockId);
      if (node_00 == (ImGuiDockNode *)0x0) {
        __assert_fail("node != __null",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                      ,0x36e8,
                      "void ImGui::DockContextBuildAddWindowsToNodes(ImGuiContext *, ImGuiID)");
      }
      if ((root_id == 0) || (pIVar2 = DockNodeGetRootNode(node_00), pIVar2->ID == root_id)) {
        DockNodeAddWindow(node_00,window_00,true);
      }
    }
    window._4_4_ = window._4_4_ + 1;
  } while( true );
}

Assistant:

void ImGui::DockContextBuildAddWindowsToNodes(ImGuiContext* ctx, ImGuiID root_id)
{
    // Rebind all windows to nodes (they can also lazily rebind but we'll have a visible glitch during the first frame)
    ImGuiContext& g = *ctx;
    for (int n = 0; n < g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        if (window->DockId == 0 || window->LastFrameActive < g.FrameCount - 1)
            continue;
        if (window->DockNode != NULL)
            continue;

        ImGuiDockNode* node = DockContextFindNodeByID(ctx, window->DockId);
        IM_ASSERT(node != NULL);   // This should have been called after DockContextBuildNodesFromSettings()
        if (root_id == 0 || DockNodeGetRootNode(node)->ID == root_id)
            DockNodeAddWindow(node, window, true);
    }
}